

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

bool __thiscall
gss::innards::HomomorphismModel::initialise_domains
          (HomomorphismModel *this,
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          *domains)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint *puVar1;
  BitWord BVar2;
  iterator __position;
  pointer pvVar3;
  pointer piVar4;
  pointer piVar5;
  Proof *pPVar6;
  Lackey *this_01;
  byte bVar7;
  int iVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  SVOBitset *pSVar12;
  undefined1 *puVar13;
  pointer pHVar14;
  int iVar15;
  uint uVar16;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var17;
  undefined1 auVar18 [8];
  ulong uVar19;
  uint uVar20;
  pointer pHVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  HomomorphismDomain *d;
  pointer pHVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  uint uVar41;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *__range2;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  patterns_ndss;
  SVOBitset ni;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  targets_ndss;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_rhs;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_lhs;
  bool wipeout;
  ulong local_1f0;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_1e0;
  undefined1 local_1c8 [16];
  undefined1 auStack_1b8 [120];
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  local_140;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  long local_e8;
  NamedVertex local_e0;
  undefined1 local_b8 [8];
  _Alloc_hider _Stack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a0 [2];
  undefined1 local_78 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  
  uVar41 = *(uint *)((long)((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->params + 0x1c);
  if (uVar41 != 1) {
    uVar41 = this->max_graphs;
  }
  uVar26 = (ulong)uVar41;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_1e0,uVar26,(allocator_type *)local_1c8);
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector(&local_140,uVar26,(allocator_type *)local_1c8);
  bVar10 = degree_and_nds_are_preserved
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params);
  if (((bVar10) &&
      (*(char *)((long)((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->params + 0x8a) == '\0')) && (uVar26 != 0)) {
    uVar27 = 0;
    do {
      uVar19 = ((long)local_1e0.
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1e0.
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if ((uVar19 < uVar27 || uVar19 - uVar27 == 0) ||
         (std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(local_1e0.
                   super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar27,(ulong)this->pattern_size),
         uVar19 = ((long)local_140.
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_140.
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
         uVar19 < uVar27 || uVar19 - uVar27 == 0)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar27);
      }
      std::
      vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
      ::resize((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)((long)local_140.
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar27 * 0x18),
               (ulong)this->target_size);
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar26);
    if (uVar26 != 0) {
      uVar24 = this->pattern_size;
      uVar26 = 0;
      do {
        bVar10 = uVar24 != 0;
        uVar24 = 0;
        iVar11 = (int)uVar26;
        if (bVar10) {
          local_e8 = (long)iVar11;
          uVar27 = 0;
          do {
            SVOBitset::SVOBitset
                      ((SVOBitset *)local_1c8,
                       (SVOBitset *)
                       ((ulong)(this->max_graphs * (int)uVar27 + iVar11) * 0x88 +
                       *(long *)&(((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                   .
                                   super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                  ._M_head_impl)->pattern_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ));
            uVar19 = (ulong)(uint)auStack_1b8._112_4_;
            pSVar12 = (SVOBitset *)local_1c8;
            if (0x10 < uVar19) {
              pSVar12 = (SVOBitset *)local_1c8._0_8_;
            }
            if (uVar19 != 0) {
              iVar22 = 0;
              uVar23 = 0;
LAB_00124f24:
              BVar2 = (pSVar12->_data).short_data[uVar23];
              uVar24 = auStack_1b8._112_4_;
              if (BVar2 == 0) goto code_r0x00124f2d;
              iVar15 = 0;
              for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
                iVar15 = iVar15 + 1;
              }
              if (iVar15 + 1 != iVar22) {
                iVar15 = iVar15 - iVar22;
                while( true ) {
                  pSVar12 = (SVOBitset *)local_1c8._0_8_;
                  if ((uint)uVar19 < 0x11) {
                    pSVar12 = (SVOBitset *)local_1c8;
                  }
                  bVar7 = (byte)iVar15 & 0x3f;
                  iVar22 = iVar15 + 0x3f;
                  if (-1 < iVar15) {
                    iVar22 = iVar15;
                  }
                  (pSVar12->_data).short_data[iVar22 >> 6] =
                       (pSVar12->_data).short_data[iVar22 >> 6] &
                       (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
                  uVar19 = ((long)local_1e0.
                                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1e0.
                                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555;
                  local_1f0 = uVar26;
                  if ((uVar19 < uVar26 || uVar19 - uVar26 == 0) ||
                     (pvVar3 = local_1e0.
                               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar26].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                     uVar19 = ((long)local_1e0.
                                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3)
                              * -0x5555555555555555, local_1f0 = uVar27,
                     uVar19 < uVar27 || uVar19 - uVar27 == 0)) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,local_1f0);
                  }
                  this_00 = pvVar3 + uVar27;
                  iVar22 = *(int *)(*(long *)(*(long *)&(((this->_imp)._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->patterns_degrees).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             + local_e8 * 0x18) + (long)iVar15 * 4);
                  local_b8._0_4_ = iVar22;
                  __position._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (this_00,__position,(int *)local_b8);
                  }
                  else {
                    *__position._M_current = iVar22;
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                  uVar19 = (ulong)(uint)auStack_1b8._112_4_;
                  pSVar12 = (SVOBitset *)local_1c8;
                  if (0x10 < uVar19) {
                    pSVar12 = (SVOBitset *)local_1c8._0_8_;
                  }
                  if (uVar19 == 0) break;
                  iVar22 = 0;
                  uVar23 = 0;
                  while (BVar2 = (pSVar12->_data).short_data[uVar23], uVar24 = auStack_1b8._112_4_,
                        BVar2 == 0) {
                    uVar23 = uVar23 + 1;
                    iVar22 = iVar22 + -0x40;
                    if (uVar19 == uVar23) goto LAB_00125058;
                  }
                  iVar8 = 0;
                  for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
                    iVar8 = iVar8 + 1;
                  }
                  iVar15 = iVar8 - iVar22;
                  if (iVar8 + 1 == iVar22) goto LAB_00125058;
                }
                goto LAB_00125056;
              }
              goto LAB_00125058;
            }
LAB_00125056:
            uVar24 = 0;
LAB_00125058:
            uVar19 = ((long)local_1e0.
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e0.
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            local_1f0 = uVar26;
            if ((uVar19 < uVar26 || uVar19 - uVar26 == 0) ||
               (pvVar3 = local_1e0.
                         super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               uVar19 = ((long)local_1e0.
                               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar26].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                        -0x5555555555555555, local_1f0 = uVar27,
               uVar19 < uVar27 || uVar19 - uVar27 == 0)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,local_1f0);
            }
            piVar4 = pvVar3[uVar27].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = *(pointer *)
                      ((long)&pvVar3[uVar27].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            if (piVar4 != piVar5) {
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                        (piVar4,piVar5,(int)LZCOUNT((long)piVar5 - (long)piVar4 >> 2) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                        (piVar4);
              uVar24 = auStack_1b8._112_4_;
            }
            if ((0x10 < uVar24) && ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)0x0)) {
              operator_delete__((void *)local_1c8._0_8_);
            }
            uVar24 = this->pattern_size;
            uVar20 = (int)uVar27 + 1;
            uVar27 = (ulong)uVar20;
          } while (uVar20 < uVar24);
        }
        uVar26 = (ulong)(iVar11 + 1U);
      } while (iVar11 + 1U != uVar41);
    }
  }
  if (this->pattern_size != 0) {
    uVar24 = 0;
    pHVar21 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar14 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    do {
      uVar26 = (ulong)uVar24;
      uVar27 = ((long)pHVar14 - (long)pHVar21 >> 3) * -0x79435e50d79435e5;
      if (uVar27 < uVar26 || uVar27 - uVar26 == 0) {
LAB_00125b72:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar26,uVar27);
      }
      pSVar12 = &pHVar21[uVar26].values;
      *(uint *)((long)(pSVar12 + -1) + 0x78) = uVar24;
      if ((ulong)pSVar12->n_words < 0x11) {
        auVar37 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        *(undefined1 (*) [64])((long)&pSVar12->_data + 0x40) = auVar37;
        auVar37 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        *(undefined1 (*) [64])&pSVar12->_data = auVar37;
      }
      else {
        memset((pSVar12->_data).long_data,0,(ulong)pSVar12->n_words << 3);
      }
      if (this->target_size != 0) {
        uVar20 = 0;
        do {
          _Var17._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
          piVar4 = *(pointer *)
                    &((_Var17._M_head_impl)->pattern_vertex_labels).
                     super__Vector_base<int,_std::allocator<int>_>;
          if ((((piVar4 == *(pointer *)((long)&(_Var17._M_head_impl)->pattern_vertex_labels + 8)) ||
               (piVar4[(int)uVar24] ==
                *(int *)(*(long *)&((_Var17._M_head_impl)->target_vertex_labels).
                                   super__Vector_base<int,_std::allocator<int>_> +
                        (long)(int)uVar20 * 4))) &&
              (bVar10 = _check_loop_compatibility(this,uVar24,uVar20), bVar10)) &&
             ((bVar10 = _check_degree_compatibility
                                  (this,uVar24,uVar20,uVar41,&local_1e0,&local_140,
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->proof).
                                             super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                                   != 0), bVar10 &&
              (bVar10 = _check_clique_compatibility(this,uVar24,uVar20), bVar10)))) {
            pHVar14 = (domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar27 = ((long)(domains->
                            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
                     -0x79435e50d79435e5;
            if (uVar27 < uVar26 || uVar27 - uVar26 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar26);
            }
            if (pHVar14[uVar26].values.n_words < 0x11) {
              pSVar12 = &pHVar14[uVar26].values;
            }
            else {
              pSVar12 = (SVOBitset *)pHVar14[uVar26].values._data.short_data[0];
            }
            uVar16 = uVar20 + 0x3f;
            if (-1 < (int)uVar20) {
              uVar16 = uVar20;
            }
            (pSVar12->_data).short_data[(int)uVar16 >> 6] =
                 (pSVar12->_data).short_data[(int)uVar16 >> 6] | 1L << ((ulong)uVar20 & 0x3f);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < this->target_size);
        pHVar14 = (domains->
                  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pHVar21 = (domains->
                  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar27 = ((long)pHVar14 - (long)pHVar21 >> 3) * -0x79435e50d79435e5;
      }
      if (uVar27 <= uVar26) goto LAB_00125b72;
      uVar27 = (ulong)pHVar21[uVar26].values.n_words;
      if (uVar27 < 0x11) {
        pSVar12 = &pHVar21[uVar26].values;
      }
      else {
        pSVar12 = (SVOBitset *)pHVar21[uVar26].values._data.short_data[0];
      }
      pHVar25 = pHVar21 + uVar26;
      if (uVar27 == 0) {
        pHVar25->count = 0;
LAB_001254cf:
        pPVar6 = (((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->proof).
                 super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (pPVar6 != (Proof *)0x0) {
          uVar41 = pHVar25->v;
          local_1c8._0_8_ = auStack_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"compatibility stage","");
          Proof::initial_domain_is_empty(pPVar6,uVar41,(string *)local_1c8);
LAB_00125516:
          if ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)auStack_1b8) goto LAB_00125918;
        }
        goto LAB_00125925;
      }
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar36 = vpbroadcastq_avx512f();
      uVar26 = 0;
      auVar37 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar39 = auVar37;
        auVar37 = vpbroadcastq_avx512f();
        auVar37 = vporq_avx512f(auVar37,auVar35);
        uVar19 = vpcmpuq_avx512f(auVar37,auVar36,2);
        auVar37 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar12->_data + uVar26 * 8));
        auVar38._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar37._8_8_;
        auVar38._0_8_ = (ulong)((byte)uVar19 & 1) * auVar37._0_8_;
        auVar38._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar37._16_8_;
        auVar38._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar37._24_8_;
        auVar38._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar37._32_8_;
        auVar38._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar37._40_8_;
        auVar38._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar37._48_8_;
        auVar38._56_8_ = (uVar19 >> 7) * auVar37._56_8_;
        uVar26 = uVar26 + 8;
        auVar37 = vpopcntq_avx512_vpopcntdq(auVar38);
        auVar31 = vpmovqd_avx512f(auVar37);
        auVar31 = vpaddd_avx2(auVar39._0_32_,auVar31);
        auVar37 = ZEXT3264(auVar31);
      } while ((uVar27 + 7 & 0x1fffffff8) != uVar26);
      auVar31 = vmovdqa32_avx512vl(auVar31);
      bVar10 = (bool)((byte)uVar19 & 1);
      auVar28._0_4_ = (uint)bVar10 * auVar31._0_4_ | (uint)!bVar10 * auVar39._0_4_;
      bVar10 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar10 * auVar31._4_4_ | (uint)!bVar10 * auVar39._4_4_;
      bVar10 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar10 * auVar31._8_4_ | (uint)!bVar10 * auVar39._8_4_;
      bVar10 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * auVar39._12_4_;
      bVar10 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar32._16_4_ = (uint)bVar10 * auVar31._16_4_ | (uint)!bVar10 * auVar39._16_4_;
      auVar32._0_16_ = auVar28;
      bVar10 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar32._20_4_ = (uint)bVar10 * auVar31._20_4_ | (uint)!bVar10 * auVar39._20_4_;
      bVar10 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar32._24_4_ = (uint)bVar10 * auVar31._24_4_ | (uint)!bVar10 * auVar39._24_4_;
      bVar10 = SUB81(uVar19 >> 7,0);
      auVar32._28_4_ = (uint)bVar10 * auVar31._28_4_ | (uint)!bVar10 * auVar39._28_4_;
      auVar28 = vphaddd_avx(auVar32._16_16_,auVar28);
      auVar28 = vphaddd_avx(auVar28,auVar28);
      auVar28 = vphaddd_avx(auVar28,auVar28);
      pHVar25->count = auVar28._0_4_;
      if (auVar28._0_4_ == 0) goto LAB_001254cf;
      uVar24 = uVar24 + 1;
    } while (uVar24 < this->pattern_size);
  }
  _Var17._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (*(long *)&((_Var17._M_head_impl)->proof).
                super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
    bVar10 = degree_and_nds_are_preserved((_Var17._M_head_impl)->params);
    _Var17._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if ((bVar10) &&
       (uVar24 = this->pattern_size,
       uVar24 != 0 && *(char *)((long)(_Var17._M_head_impl)->params + 0x8a) == '\0')) {
      uVar20 = this->target_size;
      uVar26 = 0;
      do {
        bVar10 = uVar20 != 0;
        uVar20 = 0;
        if (bVar10) {
          uVar27 = 0;
          do {
            pHVar14 = (domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(domains->
                            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
                     -0x79435e50d79435e5;
            if (uVar19 < uVar26 || uVar19 - uVar26 == 0) {
LAB_00125b9a:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar26);
            }
            if (pHVar14[uVar26].values.n_words < 0x11) {
              pSVar12 = &pHVar14[uVar26].values;
            }
            else {
              pSVar12 = (SVOBitset *)pHVar14[uVar26].values._data.short_data[0];
            }
            iVar11 = (int)uVar27;
            iVar22 = iVar11 + 0x3f;
            if (-1 < iVar11) {
              iVar22 = iVar11;
            }
            if ((((pSVar12->_data).short_data[iVar22 >> 6] >> (uVar27 & 0x3f) & 1) != 0) &&
               (bVar10 = _check_degree_compatibility
                                   (this,(int)uVar26,iVar11,uVar41,&local_1e0,&local_140,false),
               !bVar10)) {
              pHVar14 = (domains->
                        super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar19 = ((long)(domains->
                              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
                       -0x79435e50d79435e5;
              if (uVar19 < uVar26 || uVar19 - uVar26 == 0) goto LAB_00125b9a;
              if (pHVar14[uVar26].values.n_words < 0x11) {
                pSVar12 = &pHVar14[uVar26].values;
              }
              else {
                pSVar12 = (SVOBitset *)pHVar14[uVar26].values._data.short_data[0];
              }
              (pSVar12->_data).short_data[iVar22 >> 6] =
                   (pSVar12->_data).short_data[iVar22 >> 6] & ~(1L << (uVar27 & 0x3f));
              puVar1 = &pHVar14[uVar26].count;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                pPVar6 = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->proof).
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (pPVar6 == (Proof *)0x0) goto LAB_00125925;
                local_1c8._0_8_ = auStack_1b8;
                uVar41 = pHVar14[uVar26].v;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"nds stage","");
                Proof::initial_domain_is_empty(pPVar6,uVar41,(string *)local_1c8);
                goto LAB_00125516;
              }
            }
            uVar20 = this->target_size;
            uVar27 = (ulong)(iVar11 + 1U);
          } while (iVar11 + 1U < uVar20);
          uVar24 = this->pattern_size;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 < uVar24);
      _Var17._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    }
  }
  bVar10 = is_nonshrinking((_Var17._M_head_impl)->params);
  if (bVar10) {
    SVOBitset::SVOBitset((SVOBitset *)local_1c8,this->target_size,0);
    pHVar14 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar21 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar14 != pHVar21) {
      do {
        SVOBitset::operator|=((SVOBitset *)local_1c8,&pHVar14->values);
        pHVar14 = pHVar14 + 1;
      } while (pHVar14 != pHVar21);
    }
    uVar26 = (ulong)(uint)auStack_1b8._112_4_;
    pSVar12 = (SVOBitset *)local_1c8;
    if (0x10 < uVar26) {
      pSVar12 = (SVOBitset *)local_1c8._0_8_;
    }
    if (uVar26 == 0) {
      uVar41 = 0;
    }
    else {
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar36 = vpbroadcastq_avx512f();
      uVar27 = 0;
      auVar37 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar38 = auVar37;
        auVar37 = vpbroadcastq_avx512f();
        auVar37 = vporq_avx512f(auVar37,auVar35);
        uVar19 = vpcmpuq_avx512f(auVar37,auVar36,2);
        auVar37 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar12->_data + uVar27 * 8));
        auVar39._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar37._8_8_;
        auVar39._0_8_ = (ulong)((byte)uVar19 & 1) * auVar37._0_8_;
        auVar39._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar37._16_8_;
        auVar39._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar37._24_8_;
        auVar39._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar37._32_8_;
        auVar39._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar37._40_8_;
        auVar39._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar37._48_8_;
        auVar39._56_8_ = (uVar19 >> 7) * auVar37._56_8_;
        uVar27 = uVar27 + 8;
        auVar37 = vpopcntq_avx512_vpopcntdq(auVar39);
        auVar31 = vpmovqd_avx512f(auVar37);
        auVar31 = vpaddd_avx2(auVar38._0_32_,auVar31);
        auVar37 = ZEXT3264(auVar31);
      } while ((uVar26 + 7 & 0x1fffffff8) != uVar27);
      auVar31 = vmovdqa32_avx512vl(auVar31);
      bVar10 = (bool)((byte)uVar19 & 1);
      auVar29._0_4_ = (uint)bVar10 * auVar31._0_4_ | (uint)!bVar10 * auVar38._0_4_;
      bVar10 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar10 * auVar31._4_4_ | (uint)!bVar10 * auVar38._4_4_;
      bVar10 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar10 * auVar31._8_4_ | (uint)!bVar10 * auVar38._8_4_;
      bVar10 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * auVar38._12_4_;
      bVar10 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar33._16_4_ = (uint)bVar10 * auVar31._16_4_ | (uint)!bVar10 * auVar38._16_4_;
      auVar33._0_16_ = auVar29;
      bVar10 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar33._20_4_ = (uint)bVar10 * auVar31._20_4_ | (uint)!bVar10 * auVar38._20_4_;
      bVar10 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar33._24_4_ = (uint)bVar10 * auVar31._24_4_ | (uint)!bVar10 * auVar38._24_4_;
      bVar10 = SUB81(uVar19 >> 7,0);
      auVar33._28_4_ = (uint)bVar10 * auVar31._28_4_ | (uint)!bVar10 * auVar38._28_4_;
      auVar28 = vphaddd_avx(auVar33._16_16_,auVar29);
      auVar28 = vphaddd_avx(auVar28,auVar28);
      auVar28 = vphaddd_avx(auVar28,auVar28);
      uVar41 = auVar28._0_4_;
    }
    if (this->pattern_size <= uVar41) {
      if ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)0x0 && 0x10 < (uint)auStack_1b8._112_4_) {
        operator_delete__((void *)local_1c8._0_8_);
      }
      goto LAB_0012563a;
    }
    if (*(long *)&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->proof).
                  super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
      local_108.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pHVar14 = (domains->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pHVar21 = (domains->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar14 != pHVar21) {
        do {
          pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_b8,this,pHVar14->v);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<std::pair<int,std::__cxx11::string>>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&local_108,(NamedVertex *)local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Stack_b0._M_p != aaStack_a0) {
            operator_delete(_Stack_b0._M_p,aaStack_a0[0]._M_allocated_capacity + 1);
          }
          pHVar14 = pHVar14 + 1;
        } while (pHVar14 != pHVar21);
      }
      uVar9 = auStack_1b8._112_4_;
      if (0x10 < (uint)auStack_1b8._112_4_) {
        uVar26 = (ulong)(uint)auStack_1b8._112_4_;
        puVar13 = (undefined1 *)operator_new__(uVar26 * 8);
        local_b8 = (undefined1  [8])puVar13;
        memmove(puVar13,(void *)local_1c8._0_8_,uVar26 * 8);
LAB_001259d1:
        iVar11 = 0;
        uVar26 = 0;
LAB_001259d5:
        uVar27 = *(ulong *)(puVar13 + uVar26 * 8);
        if (uVar27 == 0) goto code_r0x001259de;
        iVar22 = 0;
        for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          iVar22 = iVar22 + 1;
        }
        if (iVar22 + 1 != iVar11) {
          iVar22 = iVar22 - iVar11;
          do {
            puVar13 = (undefined1 *)local_b8;
            if ((uint)uVar9 < 0x11) {
              puVar13 = local_b8;
            }
            bVar7 = (byte)iVar22 & 0x3f;
            iVar11 = iVar22 + 0x3f;
            if (-1 < iVar22) {
              iVar11 = iVar22;
            }
            *(ulong *)(puVar13 + (long)(iVar11 >> 6) * 8) =
                 *(ulong *)(puVar13 + (long)(iVar11 >> 6) * 8) &
                 (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            target_vertex_for_proof_abi_cxx11_(&local_e0,this,iVar22);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<std::pair<int,std::__cxx11::string>>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)&local_128,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
              operator_delete(local_e0.second._M_dataplus._M_p,
                              local_e0.second.field_2._M_allocated_capacity + 1);
            }
            auVar18 = (undefined1  [8])local_b8;
            if (0x10 < (uint)uVar9) {
              auVar18 = local_b8;
            }
            iVar11 = 0;
            uVar26 = 0;
            while (uVar27 = *(ulong *)((long)auVar18 + uVar26 * 8), uVar27 == 0) {
              uVar26 = uVar26 + 1;
              iVar11 = iVar11 + -0x40;
              if ((uint)uVar9 == uVar26) goto LAB_001259f7;
            }
            iVar15 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              iVar15 = iVar15 + 1;
            }
            iVar22 = iVar15 - iVar11;
          } while (iVar15 + 1 != iVar11);
        }
        goto LAB_001259f7;
      }
      auVar37._8_8_ = local_1c8._8_8_;
      auVar37._0_8_ = local_1c8._0_8_;
      auVar37._16_8_ = auStack_1b8._0_8_;
      auVar37._24_8_ = auStack_1b8._8_8_;
      auVar37._32_32_ = auStack_1b8._16_32_;
      auVar37 = vmovdqu64_avx512f(auVar37);
      auVar35 = vmovdqu64_avx512f(auStack_1b8._48_64_);
      local_78 = vmovdqu64_avx512f(auVar35);
      _local_b8 = vmovdqu64_avx512f(auVar37);
      if (auStack_1b8._112_4_ != 0) {
        puVar13 = local_b8;
        goto LAB_001259d1;
      }
LAB_001259f7:
      Proof::emit_hall_set_or_violator
                ((((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->proof).
                 super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_108,&local_128);
      if ((0x10 < (uint)uVar9) && (local_b8 != (undefined1  [8])0x0)) {
        operator_delete__((void *)local_b8);
      }
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_128);
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_108);
    }
    if ((0x10 < (uint)auStack_1b8._112_4_) && ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)0x0)) {
      operator_delete__((void *)local_1c8._0_8_);
    }
LAB_00125925:
    bVar10 = false;
  }
  else {
LAB_0012563a:
    pHVar14 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar21 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar14 != pHVar21) {
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      _Var17._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      do {
        uVar26 = (ulong)(pHVar14->values).n_words;
        if (uVar26 < 0x11) {
          pSVar12 = &pHVar14->values;
        }
        else {
          pSVar12 = (SVOBitset *)(pHVar14->values)._data.short_data[0];
        }
        if (uVar26 == 0) {
          pHVar14->count = 0;
LAB_00125701:
          pPVar6 = ((_Var17._M_head_impl)->proof).
                   super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (pPVar6 != (Proof *)0x0) {
            uVar41 = pHVar14->v;
            local_1c8._0_8_ = (SVOBitset *)auStack_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"post-initialisation stage","");
            Proof::initial_domain_is_empty(pPVar6,uVar41,(string *)local_1c8);
            if ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)auStack_1b8) {
LAB_00125918:
              operator_delete((void *)local_1c8._0_8_,(ulong)(auStack_1b8._0_8_ + 1));
            }
            goto LAB_00125925;
          }
        }
        else {
          auVar36 = vpbroadcastq_avx512f();
          uVar27 = 0;
          auVar35 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar38 = auVar35;
            auVar35 = vpbroadcastq_avx512f();
            auVar35 = vporq_avx512f(auVar35,auVar37);
            uVar19 = vpcmpuq_avx512f(auVar35,auVar36,2);
            auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar12->_data + uVar27 * 8));
            auVar40._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar35._8_8_;
            auVar40._0_8_ = (ulong)((byte)uVar19 & 1) * auVar35._0_8_;
            auVar40._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar35._16_8_;
            auVar40._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar35._24_8_;
            auVar40._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar35._32_8_;
            auVar40._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar35._40_8_;
            auVar40._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar35._48_8_;
            auVar40._56_8_ = (uVar19 >> 7) * auVar35._56_8_;
            uVar27 = uVar27 + 8;
            auVar35 = vpopcntq_avx512_vpopcntdq(auVar40);
            auVar31 = vpmovqd_avx512f(auVar35);
            auVar31 = vpaddd_avx2(auVar38._0_32_,auVar31);
            auVar35 = ZEXT3264(auVar31);
          } while ((uVar26 + 7 & 0x1fffffff8) != uVar27);
          auVar31 = vmovdqa32_avx512vl(auVar31);
          bVar10 = (bool)((byte)uVar19 & 1);
          auVar30._0_4_ = (uint)bVar10 * auVar31._0_4_ | (uint)!bVar10 * auVar38._0_4_;
          bVar10 = (bool)((byte)(uVar19 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar10 * auVar31._4_4_ | (uint)!bVar10 * auVar38._4_4_;
          bVar10 = (bool)((byte)(uVar19 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar10 * auVar31._8_4_ | (uint)!bVar10 * auVar38._8_4_;
          bVar10 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar30._12_4_ = (uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * auVar38._12_4_;
          bVar10 = (bool)((byte)(uVar19 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar10 * auVar31._16_4_ | (uint)!bVar10 * auVar38._16_4_;
          auVar34._0_16_ = auVar30;
          bVar10 = (bool)((byte)(uVar19 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar10 * auVar31._20_4_ | (uint)!bVar10 * auVar38._20_4_;
          bVar10 = (bool)((byte)(uVar19 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar10 * auVar31._24_4_ | (uint)!bVar10 * auVar38._24_4_;
          bVar10 = SUB81(uVar19 >> 7,0);
          auVar34._28_4_ = (uint)bVar10 * auVar31._28_4_ | (uint)!bVar10 * auVar38._28_4_;
          auVar28 = vphaddd_avx(auVar34._16_16_,auVar30);
          auVar28 = vphaddd_avx(auVar28,auVar28);
          auVar28 = vphaddd_avx(auVar28,auVar28);
          pHVar14->count = auVar28._0_4_;
          if (auVar28._0_4_ == 0) goto LAB_00125701;
        }
        pHVar14 = pHVar14 + 1;
      } while (pHVar14 != pHVar21);
    }
    this_01 = *(Lackey **)
               ((long)((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params + 0xc0);
    if (this_01 != (Lackey *)0x0) {
      local_1c8._8_8_ = local_b8;
      auVar35[0x3f] = 0;
      auVar35._0_63_ = stack0xffffffffffffff49;
      _local_b8 = auVar35 << 8;
      auStack_1b8._8_8_ =
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:697:58)>
           ::_M_invoke;
      auStack_1b8._0_8_ =
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:697:58)>
           ::_M_manager;
      local_1c8._0_8_ = domains;
      bVar10 = Lackey::reduce_initial_bounds(this_01,(RestrictRangeFunction *)local_1c8);
      auVar37 = _local_b8;
      if ((code *)auStack_1b8._0_8_ != (code *)0x0) {
        (*(code *)auStack_1b8._0_8_)(local_1c8,local_1c8,3);
      }
      if (!bVar10 || (auVar37 & (undefined1  [64])0x1) != (undefined1  [64])0x0) goto LAB_00125925;
    }
    bVar10 = true;
  }
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::~vector(&local_140);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_1e0);
  return bVar10;
code_r0x00124f2d:
  uVar23 = uVar23 + 1;
  iVar22 = iVar22 + -0x40;
  if (uVar19 == uVar23) goto LAB_00125058;
  goto LAB_00124f24;
code_r0x001259de:
  uVar26 = uVar26 + 1;
  iVar11 = iVar11 + -0x40;
  if ((uint)uVar9 == uVar26) goto LAB_001259f7;
  goto LAB_001259d5;
}

Assistant:

auto HomomorphismModel::initialise_domains(vector<HomomorphismDomain> & domains) const -> bool
{
    unsigned max_graphs_for_degree_things = (_imp->params.injectivity == Injectivity::LocallyInjective ? 1 : max_graphs);

    /* pattern and target neighbourhood degree sequences */
    vector<vector<vector<int>>> patterns_ndss(max_graphs_for_degree_things);
    vector<vector<optional<vector<int>>>> targets_ndss(max_graphs_for_degree_things);

    if (degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            patterns_ndss.at(g).resize(pattern_size);
            targets_ndss.at(g).resize(target_size);
        }

        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            for (unsigned i = 0; i < pattern_size; ++i) {
                auto ni = pattern_graph_row(g, i);
                for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                    ni.reset(j);
                    patterns_ndss.at(g).at(i).push_back(pattern_degree(g, j));
                }
                sort(patterns_ndss.at(g).at(i).begin(), patterns_ndss.at(g).at(i).end(), greater<int>());
            }
        }
    }

    for (unsigned i = 0; i < pattern_size; ++i) {
        domains.at(i).v = i;
        domains.at(i).values.reset();

        for (unsigned j = 0; j < target_size; ++j) {
            bool ok = true;

            if (! _check_label_compatibility(i, j))
                ok = false;
            else if (! _check_loop_compatibility(i, j))
                ok = false;
            else if (! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, _imp->proof.get()))
                ok = false;
            else if (! _check_clique_compatibility(i, j))
                ok = false;

            if (ok)
                domains.at(i).values.set(j);
        }

        domains.at(i).count = domains.at(i).values.count();
        if (0 == domains.at(i).count) {
            if (_imp->proof)
                _imp->proof->initial_domain_is_empty(domains.at(i).v, "compatibility stage");
            return false;
        }
    }

    // for proof logging, we need degree information before we can output nds proofs
    if (_imp->proof && degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            for (unsigned j = 0; j < target_size; ++j) {
                if (domains.at(i).values.test(j) &&
                    ! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, false)) {
                    domains.at(i).values.reset(j);
                    if (0 == --domains.at(i).count) {
                        if (_imp->proof)
                            _imp->proof->initial_domain_is_empty(domains.at(i).v, "nds stage");
                        return false;
                    }
                }
            }
        }
    }

    // quick sanity check that we have enough values
    if (is_nonshrinking(_imp->params)) {
        SVOBitset domains_union{target_size, 0};
        for (auto & d : domains)
            domains_union |= d.values;

        unsigned domains_union_popcount = domains_union.count();
        if (domains_union_popcount < unsigned(pattern_size)) {
            if (_imp->proof) {
                vector<NamedVertex> hall_lhs, hall_rhs;
                for (auto & d : domains)
                    hall_lhs.push_back(pattern_vertex_for_proof(d.v));
                auto dd = domains_union;
                for (auto v = dd.find_first(); v != decltype(dd)::npos; v = dd.find_first()) {
                    dd.reset(v);
                    hall_rhs.push_back(target_vertex_for_proof(v));
                }
                _imp->proof->emit_hall_set_or_violator(hall_lhs, hall_rhs);
            }
            return false;
        }
    }

    for (auto & d : domains) {
        d.count = d.values.count();
        if (0 == d.count && _imp->proof) {
            _imp->proof->initial_domain_is_empty(d.v, "post-initialisation stage");
            return false;
        }
    }

    if (_imp->params.lackey) {
        // If we're dealing with a model from Essence, it's possible some values will
        // be completely eliminated from the upper and lower bounds of certain domains,
        // in which case they won't show up as being deleted during propagation.
        bool wipeout = false;
        if (! _imp->params.lackey->reduce_initial_bounds([&](int p, int t) -> void {
                for (auto & d : domains)
                    if (d.v == unsigned(p)) {
                        if (d.values.test(t)) {
                            d.values.reset(t);
                            if (0 == --d.count)
                                wipeout = true;
                        }
                        break;
                    }
            }) ||
            wipeout) {
            return false;
        }
    }

    return true;
}